

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O0

CURLcode pop3_state_capa_resp(Curl_easy *data,int pop3code,pop3state instate)

{
  _Bool _Var1;
  unsigned_short uVar2;
  int iVar3;
  bool bVar4;
  ulong uStack_50;
  unsigned_short mechbit;
  size_t wordlen;
  size_t llen;
  size_t len;
  char *line;
  pop3_conn *pop3c;
  connectdata *conn;
  pop3state local_18;
  CURLcode result;
  pop3state instate_local;
  int pop3code_local;
  Curl_easy *data_local;
  
  conn._4_4_ = CURLE_OK;
  pop3c = (pop3_conn *)data->conn;
  line = (char *)&((connectdata *)pop3c)->proto;
  local_18 = instate;
  result = pop3code;
  _instate_local = data;
  len = (size_t)Curl_dyn_ptr(&(data->conn->proto).ftpc.pp.recvbuf);
  llen = (_instate_local->conn->proto).ftpc.pp.nfinal;
  if (result == CURLE_ABORTED_BY_CALLBACK) {
    if ((llen < 4) || (*(int *)len != 0x534c5453)) {
      if ((llen < 4) || (*(int *)len != 0x52455355)) {
        if ((4 < llen) && (iVar3 = memcmp((void *)len,"SASL ",5), iVar3 == 0)) {
          line[0xe0] = line[0xe0] | 4;
          len = len + 5;
          llen = llen - 5;
          while( true ) {
            while( true ) {
              bVar4 = false;
              if ((((llen != 0) && (bVar4 = true, *(char *)len != ' ')) &&
                  (bVar4 = true, *(char *)len != '\t')) && (bVar4 = true, *(char *)len != '\r')) {
                bVar4 = *(char *)len == '\n';
              }
              if (!bVar4) break;
              len = len + 1;
              llen = llen - 1;
            }
            if (llen == 0) break;
            uStack_50 = 0;
            while( true ) {
              bVar4 = false;
              if (((uStack_50 < llen) && (bVar4 = false, *(char *)(len + uStack_50) != ' ')) &&
                 ((bVar4 = false, *(char *)(len + uStack_50) != '\t' &&
                  (bVar4 = false, *(char *)(len + uStack_50) != '\r')))) {
                bVar4 = *(char *)(len + uStack_50) != '\n';
              }
              if (!bVar4) break;
              uStack_50 = uStack_50 + 1;
            }
            uVar2 = Curl_sasl_decode_mech((char *)len,uStack_50,&wordlen);
            if ((uVar2 != 0) && (wordlen == uStack_50)) {
              *(ushort *)(line + 0xd0) = *(ushort *)(line + 0xd0) | uVar2;
            }
            len = uStack_50 + len;
            llen = llen - uStack_50;
          }
        }
      }
      else {
        line[0xe0] = line[0xe0] | 1;
      }
    }
    else {
      line[0xe2] = line[0xe2] & 0xfdU | 2;
    }
  }
  else {
    if (result != CURLE_BAD_FUNCTION_ARGUMENT) {
      line[0xe0] = line[0xe0] | 1;
    }
    if (((_instate_local->set).use_ssl == '\0') ||
       (_Var1 = Curl_conn_is_ssl((connectdata *)pop3c,0), _Var1)) {
      conn._4_4_ = pop3_perform_authentication(_instate_local,(connectdata *)pop3c);
    }
    else if ((result == CURLE_BAD_FUNCTION_ARGUMENT) && (((byte)line[0xe2] >> 1 & 1) != 0)) {
      conn._4_4_ = pop3_perform_starttls(_instate_local,(connectdata *)pop3c);
    }
    else if ((_instate_local->set).use_ssl < 2) {
      conn._4_4_ = pop3_perform_authentication(_instate_local,(connectdata *)pop3c);
    }
    else {
      Curl_failf(_instate_local,"STLS not supported.");
      conn._4_4_ = CURLE_USE_SSL_FAILED;
    }
  }
  return conn._4_4_;
}

Assistant:

static CURLcode pop3_state_capa_resp(struct Curl_easy *data, int pop3code,
                                     pop3state instate)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct pop3_conn *pop3c = &conn->proto.pop3c;
  const char *line = Curl_dyn_ptr(&data->conn->proto.pop3c.pp.recvbuf);
  size_t len = data->conn->proto.pop3c.pp.nfinal;

  (void)instate; /* no use for this yet */

  /* Do we have a untagged continuation response? */
  if(pop3code == '*') {
    /* Does the server support the STLS capability? */
    if(len >= 4 && !memcmp(line, "STLS", 4))
      pop3c->tls_supported = TRUE;

    /* Does the server support clear text authentication? */
    else if(len >= 4 && !memcmp(line, "USER", 4))
      pop3c->authtypes |= POP3_TYPE_CLEARTEXT;

    /* Does the server support SASL based authentication? */
    else if(len >= 5 && !memcmp(line, "SASL ", 5)) {
      pop3c->authtypes |= POP3_TYPE_SASL;

      /* Advance past the SASL keyword */
      line += 5;
      len -= 5;

      /* Loop through the data line */
      for(;;) {
        size_t llen;
        size_t wordlen;
        unsigned short mechbit;

        while(len &&
              (*line == ' ' || *line == '\t' ||
               *line == '\r' || *line == '\n')) {

          line++;
          len--;
        }

        if(!len)
          break;

        /* Extract the word */
        for(wordlen = 0; wordlen < len && line[wordlen] != ' ' &&
              line[wordlen] != '\t' && line[wordlen] != '\r' &&
              line[wordlen] != '\n';)
          wordlen++;

        /* Test the word for a matching authentication mechanism */
        mechbit = Curl_sasl_decode_mech(line, wordlen, &llen);
        if(mechbit && llen == wordlen)
          pop3c->sasl.authmechs |= mechbit;

        line += wordlen;
        len -= wordlen;
      }
    }
  }
  else {
    /* Clear text is supported when CAPA is not recognised */
    if(pop3code != '+')
      pop3c->authtypes |= POP3_TYPE_CLEARTEXT;

    if(!data->set.use_ssl || Curl_conn_is_ssl(conn, FIRSTSOCKET))
      result = pop3_perform_authentication(data, conn);
    else if(pop3code == '+' && pop3c->tls_supported)
      /* Switch to TLS connection now */
      result = pop3_perform_starttls(data, conn);
    else if(data->set.use_ssl <= CURLUSESSL_TRY)
      /* Fallback and carry on with authentication */
      result = pop3_perform_authentication(data, conn);
    else {
      failf(data, "STLS not supported.");
      result = CURLE_USE_SSL_FAILED;
    }
  }

  return result;
}